

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ConstCastTestT<unsigned_short>(void)

{
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined8 local_8;
  
  local_8 = in_RAX;
  if (ConstCastTestT<unsigned_short>()::b == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::b);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::b = SVar1.m_int != 0;
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::b);
    }
  }
  if (ConstCastTestT<unsigned_short>()::w == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::w);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::w = (wchar_t)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::w);
    }
  }
  if (ConstCastTestT<unsigned_short>()::c == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::c);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_short>();
      local_8 = CONCAT26(SVar1.m_int,(undefined6)local_8);
      ConstCastTestT<unsigned_short>::c =
           SafeInt::operator_cast_to_char((SafeInt *)((long)&local_8 + 6));
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::c);
    }
  }
  if (ConstCastTestT<unsigned_short>()::sc == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::sc);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_short>();
      local_8._0_6_ = CONCAT24(SVar1.m_int,(undefined4)local_8);
      ConstCastTestT<unsigned_short>::sc =
           SafeInt::operator_cast_to_signed_char((SafeInt *)((long)&local_8 + 4));
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::sc);
    }
  }
  if (ConstCastTestT<unsigned_short>()::uc == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::uc);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_short>();
      local_8._0_4_ = CONCAT22(SVar1.m_int,(undefined2)local_8);
      ConstCastTestT<unsigned_short>::uc =
           SafeInt::operator_cast_to_unsigned_char((SafeInt *)((long)&local_8 + 2));
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::uc);
    }
  }
  if (ConstCastTestT<unsigned_short>()::s == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::s);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_short>();
      local_8 = CONCAT62(local_8._2_6_,SVar1.m_int);
      ConstCastTestT<unsigned_short>::s = SafeInt::operator_cast_to_short((SafeInt *)&local_8);
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::s);
    }
  }
  if (ConstCastTestT<unsigned_short>()::us == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::us);
    if (iVar2 != 0) {
      ConstCastTestT<unsigned_short>::us = (unsigned_short)ConstSafeInt<unsigned_short>();
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::us);
    }
  }
  if (ConstCastTestT<unsigned_short>()::i == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::i);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::i = (int)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::i);
    }
  }
  if (ConstCastTestT<unsigned_short>()::ui == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::ui);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::ui = (uint)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::ui);
    }
  }
  if (ConstCastTestT<unsigned_short>()::l == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::l);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::l = (long)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::l);
    }
  }
  if (ConstCastTestT<unsigned_short>()::ul == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::ul);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::ul = (unsigned_long)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::ul);
    }
  }
  if (ConstCastTestT<unsigned_short>()::ll == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::ll);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::ll = (longlong)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::ll);
    }
  }
  if (ConstCastTestT<unsigned_short>()::ull == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::ull);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::ull = (unsigned_long_long)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::ull);
    }
  }
  if (ConstCastTestT<unsigned_short>()::st == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::st);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::st = (size_t)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::st);
    }
  }
  if (ConstCastTestT<unsigned_short>()::pt == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::pt);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::pt = (ptrdiff_t)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::pt);
    }
  }
  if (ConstCastTestT<unsigned_short>()::pl == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<unsigned_short>()::pl);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<unsigned_short>();
      ConstCastTestT<unsigned_short>::pl = (int)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<unsigned_short>()::pl);
    }
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}